

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

LogStream * __thiscall LogStream::operator<<(LogStream *this,int v)

{
  LogStream *in_RDI;
  LogStream *unaff_retaddr;
  
  formatInteger<int>(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

LogStream& LogStream::operator<<(int v){
    formatInteger(v);
    return *this;
}